

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hfe.cpp
# Opt level: O2

bool WriteHFE(FILE *f_,shared_ptr<Disk> *disk)

{
  element_type *peVar1;
  pointer puVar2;
  bool bVar3;
  uint8_t uVar4;
  int iVar5;
  DataRate DVar6;
  int iVar7;
  Track *this;
  Sector *pSVar8;
  size_t sVar9;
  undefined4 extraout_var;
  BitBuffer *pBVar10;
  mapped_type *pmVar11;
  exception *peVar12;
  Encoding EVar13;
  uchar uVar14;
  uchar uVar15;
  undefined2 uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  uint8_t *puVar21;
  ulong uVar22;
  uchar uVar23;
  long lVar24;
  ulong uVar25;
  int local_480;
  ulong local_478;
  CylHead cylhead;
  vector<unsigned_char,_std::allocator<unsigned_char>_> header;
  map<CylHead,_BitBuffer,_std::less<CylHead>,_std::allocator<std::pair<const_CylHead,_BitBuffer>_>_>
  bitstreams;
  MEMORY mem;
  BitBuffer bitstream;
  TrackData local_2e8;
  array<HFE_TRACK,_128UL> aTrackLUT;
  
  aTrackLUT._M_elems[0].offset._0_1_ = 0xff;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&header,0x100,(value_type *)&aTrackLUT,(allocator_type *)&mem);
  puVar2 = header.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  aTrackLUT._M_elems[0].offset = 0;
  aTrackLUT._M_elems[0].track_len = 0;
  aTrackLUT._M_elems[1].offset = 0;
  aTrackLUT._M_elems[1].track_len = 0;
  this = Disk::read_track((disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                          (CylHead *)&aTrackLUT,false);
  puVar2[0] = 'H';
  puVar2[1] = 'X';
  puVar2[2] = 'C';
  puVar2[3] = 'P';
  puVar2[4] = 'I';
  puVar2[5] = 'C';
  puVar2[6] = 'F';
  puVar2[7] = 'E';
  puVar2[8] = '\0';
  iVar5 = Disk::cyls((disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  puVar2[9] = (uchar)iVar5;
  iVar5 = Disk::heads((disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  puVar2[10] = (uchar)iVar5;
  EVar13 = opt.encoding;
  if (opt.encoding == Unknown) {
    bVar3 = Track::empty(this);
    uVar15 = 0xff;
    if (!bVar3) {
      pSVar8 = Track::operator[](this,0);
      EVar13 = pSVar8->encoding;
      goto LAB_0019211b;
    }
  }
  else {
LAB_0019211b:
    uVar15 = 0xff;
    if (EVar13 - MFM < 8) {
      uVar15 = (uchar)(0xffff01000200 >> ((char)(EVar13 - MFM) * '\b' & 0x3fU));
    }
  }
  puVar2[0xb] = uVar15;
  DVar6 = opt.datarate;
  if (opt.datarate == Unknown) {
    bVar3 = Track::empty(this);
    uVar16 = 0xfa;
    if (!bVar3) {
      pSVar8 = Track::operator[](this,0);
      DVar6 = pSVar8->datarate;
      if (DVar6 != Unknown) goto LAB_00192142;
    }
  }
  else {
LAB_00192142:
    uVar16 = (undefined2)((ulong)DVar6 / 1000);
  }
  *(undefined2 *)(puVar2 + 0xc) = uVar16;
  puVar2[0xe] = '\0';
  puVar2[0xf] = '\0';
  bVar3 = Track::empty(this);
  uVar15 = '\a';
  if (!bVar3) {
    pSVar8 = Track::operator[](this,0);
    if (pSVar8->encoding - MFM < 2) {
      uVar15 = '\b';
      DVar6 = _1M;
      uVar23 = '\x01';
    }
    else {
      if (pSVar8->encoding != Amiga) goto LAB_001921dd;
      uVar15 = '\x04';
      DVar6 = _250K;
      uVar23 = '\x05';
    }
    pSVar8 = Track::operator[](this,0);
    uVar14 = '\a';
    if (pSVar8->datarate == _500K) {
      uVar14 = uVar23;
    }
    if (pSVar8->datarate != DVar6) {
      uVar15 = uVar14;
    }
  }
LAB_001921dd:
  puVar2[0x10] = uVar15;
  puVar2[0x11] = '\x01';
  puVar2[0x12] = '\x01';
  puVar2[0x13] = '\0';
  puVar2[0x14] = 0xff;
  puVar2[0x15] = 0xff;
  puVar2[0x16] = 0xff;
  puVar2[0x17] = 0xff;
  puVar2[0x18] = 0xff;
  puVar2[0x19] = 0xff;
  sVar9 = fwrite(header.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (long)header.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)header.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,1,(FILE *)f_);
  if (sVar9 == 0) {
    peVar12 = (exception *)__cxa_allocate_exception(0x10);
    util::exception::exception<char_const(&)[12]>(peVar12,(char (*) [12])"write error");
  }
  else {
    local_478 = 0;
    iVar5 = fseek((FILE *)f_,(ulong)*(ushort *)(puVar2 + 0x12) << 9,0);
    if (iVar5 == 0) {
      memset(&aTrackLUT,0,0x200);
      bitstreams._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &bitstreams._M_t._M_impl.super__Rb_tree_header._M_header;
      bitstreams._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      bitstreams._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      bitstreams._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      iVar5 = 2;
      bitstreams._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           bitstreams._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      for (uVar20 = 0; uVar20 < puVar2[9]; uVar20 = uVar20 + 1) {
        uVar22 = 0;
        for (uVar17 = 0; uVar17 < puVar2[10]; uVar17 = uVar17 + 1) {
          CylHead::CylHead(&cylhead,(int)uVar20,uVar17);
          peVar1 = (disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          iVar7 = (*peVar1->_vptr_Disk[4])(peVar1,&cylhead,0);
          TrackData::TrackData((TrackData *)&mem,(TrackData *)CONCAT44(extraout_var,iVar7));
          TrackData::preferred(&local_2e8,(TrackData *)&mem);
          pBVar10 = TrackData::bitstream(&local_2e8);
          BitBuffer::BitBuffer(&bitstream,pBVar10);
          TrackData::~TrackData(&local_2e8);
          iVar7 = BitBuffer::track_bitsize(&bitstream);
          pmVar11 = std::
                    map<CylHead,_BitBuffer,_std::less<CylHead>,_std::allocator<std::pair<const_CylHead,_BitBuffer>_>_>
                    ::operator[](&bitstreams,&cylhead);
          uVar25 = (long)(iVar7 + 7) / 8;
          if ((int)(uint)uVar22 < (int)uVar25) {
            uVar22 = uVar25 & 0xffffffff;
          }
          if ((int)local_478 <= (int)uVar22) {
            local_478 = uVar22;
          }
          BitBuffer::operator=(pmVar11,&bitstream);
          BitBuffer::~BitBuffer(&bitstream);
          TrackData::~TrackData((TrackData *)&mem);
        }
        aTrackLUT._M_elems[uVar20].offset = (uint16_t)iVar5;
        aTrackLUT._M_elems[uVar20].track_len = (short)uVar22 * 2;
        iVar5 = iVar5 + ((uint)uVar22 >> 8) + 1;
      }
      sVar9 = fwrite(&aTrackLUT,4,0x80,(FILE *)f_);
      if (sVar9 == 0x80) {
        mem.size = (int)local_478 * 2 + 0x200;
        mem._vptr_MEMORY = (_func_int **)&PTR__MEMORY_001dcd38;
        mem.pb = AllocMem(mem.size);
        uVar20 = 0;
        do {
          if (puVar2[9] <= (byte)uVar20) {
            MEMORY::~MEMORY(&mem);
            std::
            _Rb_tree<CylHead,_std::pair<const_CylHead,_BitBuffer>,_std::_Select1st<std::pair<const_CylHead,_BitBuffer>_>,_std::less<CylHead>,_std::allocator<std::pair<const_CylHead,_BitBuffer>_>_>
            ::~_Rb_tree(&bitstreams._M_t);
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      (&header.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
            return true;
          }
          for (uVar22 = 0; local_480 = (int)uVar20, uVar22 < puVar2[10]; uVar22 = uVar22 + 1) {
            CylHead::CylHead(&local_2e8.cylhead,local_480,(int)uVar22);
            pmVar11 = std::
                      map<CylHead,_BitBuffer,_std::less<CylHead>,_std::allocator<std::pair<const_CylHead,_BitBuffer>_>_>
                      ::operator[](&bitstreams,&local_2e8.cylhead);
            iVar5 = BitBuffer::track_bitsize(pmVar11);
            BitBuffer::seek(pmVar11,0);
            puVar21 = mem.pb + uVar22 * 0x100;
            uVar25 = (long)(iVar5 + 7) / 8 & 0xffffffff;
            while (uVar17 = (uint)uVar25, 0 < (int)uVar17) {
              uVar18 = 0x100;
              if (uVar17 < 0x100) {
                uVar18 = uVar17;
              }
              uVar19 = uVar17;
              if (0xff < uVar25) {
                uVar19 = 0x100;
              }
              for (lVar24 = 0; uVar19 != (uint)lVar24; lVar24 = lVar24 + 1) {
                uVar4 = BitBuffer::read8_lsb(pmVar11);
                puVar21[lVar24] = uVar4;
              }
              memset(puVar21 + lVar24,0x55,(ulong)(0x100 - uVar18));
              puVar21 = puVar21 + lVar24 + (0x200 - uVar18);
              uVar25 = (ulong)(uVar17 - uVar18);
            }
          }
          fseek((FILE *)f_,(ulong)aTrackLUT._M_elems[uVar20].offset << 9,0);
          uVar22 = (ulong)(aTrackLUT._M_elems[uVar20].track_len + 0x1ff & 0x1fe00);
          sVar9 = fwrite(mem.pb,1,uVar22,(FILE *)f_);
          uVar20 = (ulong)(byte)((byte)uVar20 + 1);
        } while (sVar9 == uVar22);
        peVar12 = (exception *)__cxa_allocate_exception(0x10);
        util::exception::exception<char_const(&)[12]>(peVar12,(char (*) [12])"write error");
        __cxa_throw(peVar12,&util::exception::typeinfo,std::runtime_error::~runtime_error);
      }
      peVar12 = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<char_const(&)[12]>(peVar12,(char (*) [12])"write error");
      __cxa_throw(peVar12,&util::exception::typeinfo,std::runtime_error::~runtime_error);
    }
    peVar12 = (exception *)__cxa_allocate_exception(0x10);
    util::exception::exception<char_const(&)[11]>(peVar12,(char (*) [11])"seek error");
  }
  __cxa_throw(peVar12,&util::exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool WriteHFE(FILE* f_, std::shared_ptr<Disk>& disk)
{
    std::vector<uint8_t> header(256, 0xff);
    auto& hh = *reinterpret_cast<HFE_HEADER*>(header.data());

    auto& track0 = disk->read_track({ 0, 0 });

    strncpy(hh.header_signature, HFE_SIGNATURE, sizeof(hh.header_signature));
    hh.format_revision = 0x00;
    hh.number_of_tracks = static_cast<uint8_t>(disk->cyls());
    hh.number_of_sides = static_cast<uint8_t>(disk->heads());
    hh.track_encoding = HfeTrackEncoding(track0);
    hh.bitrate_kbps = util::htole(HfeDataRate(track0));
    hh.floppy_rpm = 0;
    hh.floppy_interface_mode = HfeInterfaceMode(track0);
    hh.do_not_use = 0x01;
    hh.track_list_offset = util::htole(static_cast<uint16_t>(0x200 >> 9));
    hh.write_allowed = 0xff;
    hh.single_step = 0xff;
    hh.track0s0_altencoding = 0xff;
    hh.track0s0_encoding = 0xff;
    hh.track0s1_altencoding = 0xff;
    hh.track0s1_encoding = 0xff;

    if (!fwrite(header.data(), header.size(), 1, f_))
        throw util::exception("write error");
    if (fseek(f_, hh.track_list_offset << 9, SEEK_SET))
        throw util::exception("seek error");

    std::array<HFE_TRACK, MAX_TRACKS> aTrackLUT{};
    std::map<CylHead, BitBuffer> bitstreams;
    int data_offset = 2;

    auto max_disk_track_bytes = 0;
    for (uint8_t cyl = 0; cyl < hh.number_of_tracks; ++cyl)
    {
        auto max_track_bytes = 0;
        for (uint8_t head = 0; head < hh.number_of_sides; ++head)
        {
            CylHead cylhead(cyl, head);
            auto trackdata = disk->read(cylhead);
            auto bitstream = trackdata.preferred().bitstream();
            auto track_bytes = (bitstream.track_bitsize() + 7) / 8;
            max_track_bytes = std::max(track_bytes, max_track_bytes);
            max_disk_track_bytes = std::max(max_disk_track_bytes, max_track_bytes);
            bitstreams[cylhead] = std::move(bitstream);
        }

        aTrackLUT[cyl].offset = util::htole(static_cast<uint16_t>(data_offset));
        aTrackLUT[cyl].track_len = util::htole(static_cast<uint16_t>(max_track_bytes * 2));

        data_offset += ((max_track_bytes * 2) / 512) + 1;
    }

    if (fwrite(aTrackLUT.data(), sizeof(aTrackLUT[0]), aTrackLUT.size(), f_) != aTrackLUT.size())
        throw util::exception("write error");

    MEMORY mem(max_disk_track_bytes * 2 + 512);
    for (uint8_t cyl = 0; cyl < hh.number_of_tracks; ++cyl)
    {
        uint8_t* pbTrack{};
        for (uint8_t head = 0; head < hh.number_of_sides; ++head)
        {
            auto& bitstream = bitstreams[{ cyl, head }];
            auto track_bytes = (bitstream.track_bitsize() + 7) / 8;
            bitstream.seek(0);

            pbTrack = mem.pb + head * 256;
            while (track_bytes > 0)
            {
                auto chunk_size = std::min(track_bytes, 0x100);
                for (int i = 0; i < chunk_size; ++i)
                    *pbTrack++ = bitstream.read8_lsb();
                memset(pbTrack, 0x55, 0x100 - chunk_size);
                pbTrack += 0x200 - chunk_size;
                track_bytes -= chunk_size;
            }
        }

        fseek(f_, util::letoh(aTrackLUT[cyl].offset) * 512, SEEK_SET);
        auto track_len = (util::letoh(aTrackLUT[cyl].track_len) + 511) & ~0x1ff;
        if (fwrite(mem.pb, 1, track_len, f_) != static_cast<size_t>(track_len))
            throw util::exception("write error");
    }

    return true;
}